

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O0

void __thiscall Fl_Text_Buffer::text(Fl_Text_Buffer *this,char *t)

{
  int iVar1;
  int nInserted;
  char *deletedText_00;
  size_t sVar2;
  char *pcVar3;
  int insertedLength;
  int deletedLength;
  char *deletedText;
  char *t_local;
  Fl_Text_Buffer *this_local;
  
  deletedText = t;
  if (t == (char *)0x0) {
    deletedText = "";
  }
  iVar1 = length(this);
  call_predelete_callbacks(this,0,iVar1);
  deletedText_00 = text(this);
  iVar1 = this->mLength;
  free(this->mBuf);
  sVar2 = strlen(deletedText);
  nInserted = (int)sVar2;
  pcVar3 = (char *)malloc((long)(nInserted + this->mPreferredGapSize));
  this->mBuf = pcVar3;
  this->mLength = nInserted;
  this->mGapStart = nInserted;
  this->mGapEnd = this->mGapStart + this->mPreferredGapSize;
  memcpy(this->mBuf,deletedText,(long)nInserted);
  update_selections(this,0,iVar1,0);
  call_modify_callbacks(this,0,iVar1,nInserted,0,deletedText_00);
  free(deletedText_00);
  return;
}

Assistant:

void Fl_Text_Buffer::text(const char *t)
{
  IS_UTF8_ALIGNED(t)

  // if t is null then substitute it with an empty string
  // then don't return so that internal cleanup can happen
  if (!t) t="";

  call_predelete_callbacks(0, length());
  
  /* Save information for redisplay, and get rid of the old buffer */
  const char *deletedText = text();
  int deletedLength = mLength;
  free((void *) mBuf);
  
  /* Start a new buffer with a gap of mPreferredGapSize at the end */
  int insertedLength = (int) strlen(t);
  mBuf = (char *) malloc(insertedLength + mPreferredGapSize);
  mLength = insertedLength;
  mGapStart = insertedLength;
  mGapEnd = mGapStart + mPreferredGapSize;
  memcpy(mBuf, t, insertedLength);
  
  /* Zero all of the existing selections */
  update_selections(0, deletedLength, 0);
  
  /* Call the saved display routine(s) to update the screen */
  call_modify_callbacks(0, deletedLength, insertedLength, 0, deletedText);
  free((void *) deletedText);
}